

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Creature.cpp
# Opt level: O3

void __thiscall Creature::make_sweet_sweet_love(Creature *this,Creature *mate,size_t xpnt)

{
  pointer psVar1;
  runtime_error *this_00;
  pointer psVar2;
  pointer psVar3;
  double dVar4;
  
  psVar2 = (this->chroms).
           super__Vector_base<boost::shared_ptr<Chromosome>,_std::allocator<boost::shared_ptr<Chromosome>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  psVar1 = (this->chroms).
           super__Vector_base<boost::shared_ptr<Chromosome>,_std::allocator<boost::shared_ptr<Chromosome>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if ((long)psVar1 - (long)psVar2 !=
      (long)(mate->chroms).
            super__Vector_base<boost::shared_ptr<Chromosome>,_std::allocator<boost::shared_ptr<Chromosome>_>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)(mate->chroms).
            super__Vector_base<boost::shared_ptr<Chromosome>,_std::allocator<boost::shared_ptr<Chromosome>_>_>
            ._M_impl.super__Vector_impl_data._M_start) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"Mate has wrong number of chromosomes! Sick!");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  psVar3 = psVar2;
  if (psVar2 != psVar1) {
    do {
      if (psVar2->px == (Chromosome *)0x0) {
        __assert_fail("px != 0","/usr/include/boost/smart_ptr/shared_ptr.hpp",0x2d8,
                      "typename boost::detail::sp_member_access<T>::type boost::shared_ptr<Chromosome>::operator->() const [T = Chromosome]"
                     );
      }
      Chromosome::crossover
                (psVar2->px,
                 (shared_ptr<Chromosome> *)
                 (((long)(mate->chroms).
                         super__Vector_base<boost::shared_ptr<Chromosome>,_std::allocator<boost::shared_ptr<Chromosome>_>_>
                         ._M_impl.super__Vector_impl_data._M_start -
                  (long)(this->chroms).
                        super__Vector_base<boost::shared_ptr<Chromosome>,_std::allocator<boost::shared_ptr<Chromosome>_>_>
                        ._M_impl.super__Vector_impl_data._M_start) + (long)psVar3),xpnt);
      psVar2 = psVar2 + 1;
      psVar3 = psVar3 + 1;
    } while (psVar2 != (this->chroms).
                       super__Vector_base<boost::shared_ptr<Chromosome>,_std::allocator<boost::shared_ptr<Chromosome>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  }
  dVar4 = make_fitness(this);
  this->fitness = dVar4;
  dVar4 = make_fitness(this);
  mate->fitness = dVar4;
  return;
}

Assistant:

void Creature::make_sweet_sweet_love( Creature & mate, size_t xpnt )
{
	if(chroms.size() != mate.chroms.size())
	{
		throw std::runtime_error("Mate has wrong number of chromosomes! Sick!");
	}

	for(chroms_t::iterator it = chroms.begin(); it != chroms.end(); ++it)
	{
		(*it)->crossover(mate.chroms[std::distance(chroms.begin(), it)], xpnt);
	}

	fitness = make_fitness();
	mate.fitness = make_fitness();
}